

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event_listener.c
# Opt level: O1

apx_clientEventListener_t * apx_clientEventListener_clone(apx_clientEventListener_t *other)

{
  void *pvVar1;
  _func_void_void_ptr_apx_clientConnection_tag_ptr *p_Var2;
  clientRequirePortWriteFuncType1 *pcVar3;
  apx_clientEventListener_t *paVar4;
  
  if (other == (apx_clientEventListener_t *)0x0) {
    paVar4 = (apx_clientEventListener_t *)0x0;
  }
  else {
    paVar4 = (apx_clientEventListener_t *)malloc(0x20);
    if (paVar4 != (apx_clientEventListener_t *)0x0) {
      pvVar1 = other->arg;
      p_Var2 = other->client_connect1;
      pcVar3 = other->require_port_write1;
      paVar4->client_disconnect1 = other->client_disconnect1;
      paVar4->require_port_write1 = pcVar3;
      paVar4->arg = pvVar1;
      paVar4->client_connect1 = p_Var2;
    }
  }
  return paVar4;
}

Assistant:

apx_clientEventListener_t *apx_clientEventListener_clone(apx_clientEventListener_t *other)
{
   if (other != 0)
   {
      apx_clientEventListener_t *self = (apx_clientEventListener_t*) malloc(sizeof(apx_clientEventListener_t));
      if (self != 0)
      {
         *self = *other;
      }
      return self;
   }
   return (apx_clientEventListener_t*) 0;
}